

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O2

service * std::experimental::net::v1::detail::service_registry::
          create<std::experimental::net::v1::detail::scheduler,std::experimental::net::v1::execution_context>
                    (void *owner)

{
  scheduler *this;
  
  this = (scheduler *)operator_new(0xf0);
  webfront::http::std::experimental::net::v1::detail::scheduler::scheduler
            (this,(execution_context *)owner,0);
  return (service *)this;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}